

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[2],int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
                   (string *__return_storage_ptr__,char (*arg) [2],int *args,char (*args_1) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [9])

{
  string sStack_68;
  string local_48;
  
  StringBuilder_abi_cxx11_(&local_48,*arg);
  StringBuilder<int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
            (&sStack_68,args,args_1,args_2,args_3);
  std::operator+(__return_storage_ptr__,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}